

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 572_subtreeOfAnotherTreeElegantSol.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  TreeNode *this;
  TreeNode *pTVar2;
  ostream *this_00;
  TreeNode *t;
  TreeNode *s;
  
  this = (TreeNode *)operator_new(0x18);
  TreeNode::TreeNode(this,1);
  pTVar2 = (TreeNode *)operator_new(0x18);
  TreeNode::TreeNode(pTVar2,1);
  this->left = pTVar2;
  pTVar2 = (TreeNode *)operator_new(0x18);
  TreeNode::TreeNode(pTVar2,2);
  this->left->left = pTVar2;
  pTVar2 = (TreeNode *)operator_new(0x18);
  TreeNode::TreeNode(pTVar2,1);
  bVar1 = isSubtree(this,pTVar2);
  this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
	TreeNode* s = new TreeNode(1);
	s->left = new TreeNode(1);
    s->left->left = new TreeNode(2);

	TreeNode* t = new TreeNode(1);

	cout<<isSubtree(s,t)<<endl;

}